

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O2

int erkStep_ComputeSolutions(ARKodeMem ark_mem,realtype *dsmPtr)

{
  void *pvVar1;
  N_Vector z;
  N_Vector z_00;
  realtype *c;
  N_Vector *X;
  uint nvec;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  realtype rVar6;
  
  pvVar1 = ark_mem->step_mem;
  if (pvVar1 == (void *)0x0) {
    arkProcessError(ark_mem,-0x15,"ARKode::ERKStep","erkStep_ComputeSolutions",
                    "Time step module memory is NULL.");
    iVar5 = -0x15;
  }
  else {
    z = ark_mem->ycur;
    z_00 = ark_mem->tempv1;
    c = *(realtype **)((long)pvVar1 + 0x30);
    X = *(N_Vector **)((long)pvVar1 + 0x38);
    *dsmPtr = 0.0;
    uVar4 = 0;
    uVar3 = (ulong)*(uint *)((long)pvVar1 + 0x18);
    if ((int)*(uint *)((long)pvVar1 + 0x18) < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      c[uVar4] = ark_mem->h *
                 *(double *)(*(long *)(*(long *)((long)pvVar1 + 0x20) + 0x20) + uVar4 * 8);
      X[uVar4] = *(N_Vector *)(*(long *)((long)pvVar1 + 8) + uVar4 * 8);
    }
    c[uVar3] = 1.0;
    X[uVar3] = ark_mem->yn;
    iVar2 = N_VLinearCombination((int)uVar3 + 1,c,X,z);
    iVar5 = -0x1c;
    if ((iVar2 == 0) && (iVar5 = 0, ark_mem->fixedstep == 0)) {
      uVar3 = 0;
      nvec = *(uint *)((long)pvVar1 + 0x18);
      if ((int)*(uint *)((long)pvVar1 + 0x18) < 1) {
        nvec = 0;
      }
      for (; nvec != uVar3; uVar3 = uVar3 + 1) {
        c[uVar3] = (*(double *)(*(long *)(*(long *)((long)pvVar1 + 0x20) + 0x20) + uVar3 * 8) -
                   *(double *)(*(long *)(*(long *)((long)pvVar1 + 0x20) + 0x28) + uVar3 * 8)) *
                   ark_mem->h;
        X[uVar3] = *(N_Vector *)(*(long *)((long)pvVar1 + 8) + uVar3 * 8);
      }
      iVar2 = N_VLinearCombination(nvec,c,X,z_00);
      iVar5 = -0x1c;
      if (iVar2 == 0) {
        rVar6 = N_VWrmsNorm(z_00,ark_mem->ewt);
        *dsmPtr = rVar6;
        iVar5 = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

int erkStep_ComputeSolutions(ARKodeMem ark_mem, realtype *dsmPtr)
{
  /* local data */
  int retval, j, nvec;
  N_Vector y, yerr;
  realtype* cvals;
  N_Vector* Xvecs;
  ARKodeERKStepMem step_mem;

  /* access ARKodeERKStepMem structure */
  if (ark_mem->step_mem==NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ERKStep",
                    "erkStep_ComputeSolutions", MSG_ERKSTEP_NO_MEM);
    return(ARK_MEM_NULL);
  }
  step_mem = (ARKodeERKStepMem) ark_mem->step_mem;

  /* set N_Vector shortcuts */
  y    = ark_mem->ycur;
  yerr = ark_mem->tempv1;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* initialize output */
  *dsmPtr = ZERO;


  /* Compute time step solution */
  /*   set arrays for fused vector operation */
  nvec = 0;
  for (j=0; j<step_mem->stages; j++) {
    cvals[nvec] = ark_mem->h * step_mem->B->b[j];
    Xvecs[nvec] = step_mem->F[j];
    nvec += 1;
  }
  cvals[nvec] = ONE;
  Xvecs[nvec] = ark_mem->yn;
  nvec += 1;

  /*   call fused vector operation to do the work */
  retval = N_VLinearCombination(nvec, cvals, Xvecs, y);
  if (retval != 0) return(ARK_VECTOROP_ERR);

  /* Compute yerr (if step adaptivity enabled) */
  if (!ark_mem->fixedstep) {

    /* set arrays for fused vector operation */
    nvec = 0;
    for (j=0; j<step_mem->stages; j++) {
      cvals[nvec] = ark_mem->h * (step_mem->B->b[j] - step_mem->B->d[j]);
      Xvecs[nvec] = step_mem->F[j];
      nvec += 1;
    }

    /* call fused vector operation to do the work */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, yerr);
    if (retval != 0) return(ARK_VECTOROP_ERR);

    /* fill error norm */
    *dsmPtr = N_VWrmsNorm(yerr, ark_mem->ewt);
  }

  return(ARK_SUCCESS);
}